

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O0

Vector2 __thiscall cp::cpgen::calcEndCP(cpgen *this,Pose *ref_land_pose)

{
  double dVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *pDVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Pose *in_RDX;
  double dVar5;
  double in_XMM1_Qa;
  Vector2 VVar6;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_30 [16];
  Pose *local_20;
  Pose *ref_land_pose_local;
  cpgen *this_local;
  Vector2 *end_cp;
  
  local_20 = in_RDX;
  ref_land_pose_local = ref_land_pose;
  this_local = this;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)this,local_30);
  if ((*(int *)&ref_land_pose[10].field_0x1c == 4) || (*(int *)&ref_land_pose[10].field_0x1c == 3))
  {
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
             Pose::p(local_20 + *(uint *)&ref_land_pose[10].field_0x18);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x(pDVar2);
    dVar5 = *pdVar3;
    dVar1 = ref_land_pose[10].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)this);
    *pSVar4 = dVar5 + dVar1;
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)Pose::p(local_20);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y(pDVar2);
    dVar5 = *pdVar3;
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)Pose::p(local_20 + 1);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y(pDVar2);
    in_XMM1_Qa = 0.5;
    dVar5 = (dVar5 + *pdVar3) * 0.5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)this);
    *pSVar4 = dVar5;
  }
  else {
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
             Pose::p(local_20 + *(uint *)&ref_land_pose[10].field_0x18);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x(pDVar2);
    dVar5 = *pdVar3;
    dVar1 = ref_land_pose[10].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)this);
    *pSVar4 = dVar5 + dVar1;
    if (*(int *)&ref_land_pose[10].field_0x18 == 0) {
      pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
               Pose::p(local_20 + *(uint *)&ref_land_pose[10].field_0x18);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y(pDVar2);
      dVar5 = *pdVar3 + ref_land_pose[10].qq.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[1];
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)this);
      *pSVar4 = dVar5;
    }
    else {
      pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
               Pose::p(local_20 + *(uint *)&ref_land_pose[10].field_0x18);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y(pDVar2);
      dVar5 = *pdVar3 - ref_land_pose[10].qq.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[1];
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)this);
      *pSVar4 = dVar5;
    }
  }
  VVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar5;
  return (Vector2)VVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array;
}

Assistant:

Vector2 cpgen::calcEndCP(const Pose ref_land_pose[]) {

  Vector2 end_cp = Vector2::Zero();
  if (wstate == stopping2 || wstate == stopping1) {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    end_cp.y() = (ref_land_pose[0].p().y() + ref_land_pose[1].p().y()) * 0.5;
  } else {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    if (swingleg == right) {
      end_cp.y() = ref_land_pose[swingleg].p().y() + end_cp_offset[1];
    } else {
      end_cp.y() = ref_land_pose[swingleg].p().y() - end_cp_offset[1];
    }
  }
  return end_cp;
}